

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::genRandomBlendState
               (Random *rng,BlendState *blendState)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  BlendEq BVar4;
  BlendEq BVar5;
  anon_union_8_2_d0736028_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_5
  aVar6;
  undefined1 local_48 [2];
  bool local_46;
  bool local_45;
  anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
  local_40;
  anon_union_16_2_d0736028_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_5
  local_38;
  
  bVar1 = de::Random::getBool(rng);
  if (bVar1) {
    bVar1 = de::Random::getBool(rng);
    (blendState->enableBlend).field_1.m_data[0] = bVar1;
    (blendState->enableBlend).m_ptr = (bool *)&(blendState->enableBlend).field_1;
  }
  bVar1 = de::Random::getBool(rng);
  if (bVar1) {
    bVar1 = de::Random::getBool(rng);
    if (!bVar1) {
      BVar4 = getRandomBlendEq(rng);
      BVar5 = getRandomBlendEq(rng);
      local_38.m_align._4_4_ = BVar5;
      local_38.m_align._0_4_ = BVar4;
    }
    else {
      local_38.m_align._0_4_ = getRandomBlendEq(rng);
    }
    local_48[0] = bVar1;
    local_40.m_first = (BlendFunc *)&local_38;
    tcu::
    Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
    ::operator=(&blendState->blendEq,
                (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)local_48);
  }
  bVar1 = de::Random::getBool(rng);
  if (bVar1) {
    bVar1 = de::Random::getBool(rng);
    if (!bVar1) {
      aVar6 = (anon_union_8_2_d0736028_for_Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_5
               )getRandomBlendFunc(rng);
      local_38._8_8_ = getRandomBlendFunc(rng);
      local_38.m_align = (deUint64)aVar6;
    }
    else {
      local_38.m_align = (deUint64)getRandomBlendFunc(rng);
    }
    local_48[0] = bVar1;
    local_40.m_first = (BlendFunc *)&local_38;
    tcu::
    Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
    ::operator=(&blendState->blendFunc,
                (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)local_48);
  }
  bVar1 = de::Random::getBool(rng);
  if (bVar1) {
    bVar1 = de::Random::getBool(rng);
    bVar2 = de::Random::getBool(rng);
    bVar3 = de::Random::getBool(rng);
    local_45 = de::Random::getBool(rng);
    local_48[0] = bVar1;
    local_48[1] = bVar3;
    local_46 = bVar2;
    tcu::Maybe<tcu::Vector<bool,_4>_>::operator=(&blendState->colorMask,(Vector<bool,_4> *)local_48)
    ;
  }
  return;
}

Assistant:

void genRandomBlendState (de::Random& rng, BlendState& blendState)
{
	if (rng.getBool())
		blendState.enableBlend = rng.getBool();

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendEq = getRandomBlendEq(rng);
		else
		{
			const BlendEq	rgb		= getRandomBlendEq(rng);
			const BlendEq	alpha	= getRandomBlendEq(rng);

			blendState.blendEq		= SeparateBlendEq(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendFunc = getRandomBlendFunc(rng);
		else
		{
			const BlendFunc	rgb		= getRandomBlendFunc(rng);
			const BlendFunc	alpha	= getRandomBlendFunc(rng);

			blendState.blendFunc	= SeparateBlendFunc(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		const bool red		= rng.getBool();
		const bool green	= rng.getBool();
		const bool blue		= rng.getBool();
		const bool alpha	= rng.getBool();

		blendState.colorMask = BVec4(red, blue, green, alpha);
	}
}